

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNAnonFunc::gen_code(CTPNAnonFunc *this,int discard,int param_3)

{
  int iVar1;
  CTPNCodeBody *this_00;
  CTcCodeStream *in_RCX;
  void *__buf;
  void *__buf_00;
  int in_ESI;
  CTPNCodeBodyBase *in_RDI;
  int our_varnum;
  CTcCodeBodyCtx *cur_ctx;
  int argc;
  uchar in_stack_000000af;
  CTcGenTarg *in_stack_000000b0;
  ulong in_stack_ffffffffffffffb8;
  uint val;
  CTcCodeStream *pCVar2;
  CTcDataStream *in_stack_ffffffffffffffc0;
  CTcDataStream *in_stack_ffffffffffffffc8;
  int local_24;
  CTcCodeBodyCtx *local_20;
  int local_14;
  
  if (in_ESI == 0) {
    local_14 = 0;
    for (local_20 = CTPNCodeBodyBase::get_ctx_tail
                              ((CTPNCodeBodyBase *)
                               (in_RDI->super_CTPNStmTop).super_CTPNStm.super_CTPNStmBase.next_stm_)
        ; local_20 != (CTcCodeBodyCtx *)0x0; local_20 = local_20->prv_) {
      this_00 = CTcCodeStream::get_code_body(G_cs);
      iVar1 = CTPNCodeBodyBase::get_ctx_var_for_level
                        (&this_00->super_CTPNCodeBodyBase,local_20->level_ + -1,&local_24);
      if (iVar1 == 0) {
        iVar1 = CTPNCodeBodyBase::is_anon_method
                          ((CTPNCodeBodyBase *)
                           (in_RDI->super_CTPNStmTop).super_CTPNStm.super_CTPNStmBase.next_stm_);
        if (iVar1 != 0) {
          CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
          CTcGenTarg::note_push((CTcGenTarg *)0x2dfadc);
        }
      }
      else {
        CTcSymLocal::s_gen_code_getlcl(0,0x2dfaa4);
      }
      local_14 = local_14 + 1;
    }
    iVar1 = CTcGenTarg::is_eval_for_dyn(G_cg);
    if (iVar1 == 0) {
      CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
      val = (uint)(in_stack_ffffffffffffffb8 >> 0x20);
      CTPNCodeBodyBase::add_abs_fixup(in_RDI,in_stack_ffffffffffffffc8);
      CTcDataStream::write4((CTcDataStream *)in_RDI,(ulong)in_stack_ffffffffffffffc8);
    }
    else {
      CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
      in_RCX = G_cs;
      CTPNStmTop::get_dyn_obj_id
                ((CTPNStmTop *)(in_RDI->super_CTPNStmTop).super_CTPNStm.super_CTPNStmBase.next_stm_)
      ;
      CTcDataStream::write_obj_id(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      val = (uint)(in_stack_ffffffffffffffb8 >> 0x20);
    }
    local_14 = local_14 + 1;
    CTcGenTarg::note_push((CTcGenTarg *)0x2dfbb0);
    if ((1 < local_14) ||
       (iVar1 = CTPNCodeBodyBase::has_local_ctx
                          ((CTPNCodeBodyBase *)
                           (in_RDI->super_CTPNStmTop).super_CTPNStm.super_CTPNStmBase.next_stm_),
       iVar1 != 0)) {
      if (local_14 < 0x100) {
        CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)local_14,__buf,(size_t)in_RCX);
        pCVar2 = G_cs;
        iVar1 = CTcGenTarg::get_predef_meta_idx(G_cg,5);
        CTcDataStream::write(&pCVar2->super_CTcDataStream,(int)(char)iVar1,__buf_00,(size_t)in_RCX);
      }
      else {
        CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
        CTcDataStream::write2(in_stack_ffffffffffffffc0,val);
        pCVar2 = G_cs;
        CTcGenTarg::get_predef_meta_idx(G_cg,5);
        CTcDataStream::write2(in_stack_ffffffffffffffc0,(uint)((ulong)pCVar2 >> 0x20));
      }
      CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
      CTcGenTarg::note_pop(G_cg,local_14 + -1);
    }
  }
  return;
}

Assistant:

void CTPNAnonFunc::gen_code(int discard, int)
{
    /* if we're discarding the value, don't bother generating the code */
    if (discard)
        return;

    /* 
     *   Push each context object - these are the additional arguments to
     *   the anonymous function pointer object's constructor beyond the
     *   function pointer itself.  Note that we must push the arguments in
     *   reverse order of our list, since arguments are always pushed from
     *   last to first.  
     */
    int argc = 0;
    for (CTcCodeBodyCtx *cur_ctx = code_body_->get_ctx_tail() ; cur_ctx != 0 ;
         cur_ctx = cur_ctx->prv_, ++argc)
    {
        /* 
         *   find our context matching this context - the caller's
         *   contexts are all one level lower than the callee's contexts,
         *   because the caller is at the next recursion level out 
         */
        int our_varnum;
        if (G_cs->get_code_body()
            ->get_ctx_var_for_level(cur_ctx->level_ - 1, &our_varnum))
        {
			/* 
			 *   push this context object - to do this, simply retrieve the
			 *   value of the local variable in our frame that contains this
			 *   context level 
			 */
			CTcSymLocal::s_gen_code_getlcl(our_varnum, FALSE);
		}
		else if (code_body_->is_anon_method())
		{
			/* 
			 *   anonymous methods don't use context variables, since they
			 *   use the live method context 
			 */
			G_cg->write_op(OPC_PUSHNIL);
			G_cg->note_push();
		}
		else
		{
			/* 
			 *   If this is an anonymous function (rather than an anonymous
			 *   method), we require the context variable.  Anonymous methods
			 *   don't use these.
			 */
			assert(FALSE);
		}
    }

    /* 
     *   The first argument (and thus last pushed) to the constructor is the
     *   constant function pointer that refers to the code of the anonymous
     *   function.
     *   
     *   For regular static compilation, the function pointer is a simple
     *   code offset constant.  For run-time compilation (in the debugger or
     *   interpreter "eval()" facility), it's a DynamicFunc representing the
     *   dynamically compiled code.  
     */
    if (G_cg->is_eval_for_dyn())
    {
        /* 
         *   Dynamic (run-time) compilation - the bytecode is in a
         *   dynamically created DynamicFunc instance.  The dynamic compiler
         *   assigns object IDs for the anonymous function code body before
         *   generating any code for any referencing object, so we simply
         *   generate a PUSHOBJ for the code body's object ID. 
         */
        G_cg->write_op(OPC_PUSHOBJ);
        G_cs->write_obj_id(code_body_->get_dyn_obj_id());
    }
    else
    {
        /* conventional static compiler - the bytecode is in the code pool */
        G_cg->write_op(OPC_PUSHFNPTR);
        code_body_->add_abs_fixup(G_cs);
        G_cs->write4(0);
    }

    /* count the argument */
    ++argc;

    /* note the push of the function pointer argument */
    G_cg->note_push();

    /*
     *   If we have a local context, we need to create an anonymous function
     *   metaclass object that combines the function pointer with the local
     *   context.  If we don't have a local context, this is a simple static
     *   function that we can call directly, in which case we're already done
     *   since we've pushed the function pointer.  
     */
    if (argc > 1 || code_body_->has_local_ctx())
    {
        /* 
         *   We have a local context, so we need create to create the
         *   anonymous function metaclass object.  Generate the NEW.  
         */
        if (argc <= 255)
        {
            G_cg->write_op(OPC_NEW1);
            G_cs->write((char)argc);
            G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_ANONFN));
        }
        else
        {
            G_cg->write_op(OPC_NEW2);
            G_cs->write2(argc);
            G_cs->write2(G_cg->get_predef_meta_idx(TCT3_METAID_ANONFN));
        }
        
        /* push the object value */
        G_cg->write_op(OPC_GETR0);

        /* the 'new' popped the arguments, then we pushed the result */
        G_cg->note_pop(argc - 1);
    }
}